

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageFuncs.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::builtins::CoverageNameOrHierFunc::bindArgument
          (CoverageNameOrHierFunc *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax
          ,Args *args)

{
  bool bVar1;
  ASTContext *pAVar2;
  SyntaxNode *in_RCX;
  ASTContext *in_RSI;
  ExpressionSyntax *in_RDI;
  SystemSubroutine *in_R8;
  ASTContext *in_stack_00000028;
  ExpressionSyntax *in_stack_00000030;
  ASTContext *in_stack_000002c0;
  NameSyntax *in_stack_000002c8;
  Compilation *in_stack_000002d0;
  bitmask<slang::ast::LookupFlags> in_stack_000002dc;
  Args *in_stack_ffffffffffffffb0;
  ASTContext *context_00;
  size_t in_stack_ffffffffffffffc8;
  Expression *local_8;
  
  context_00 = in_RSI;
  pAVar2 = (ASTContext *)
           std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::size
                     ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *
                      )&in_RDI[2].super_SyntaxNode.parent);
  if (context_00 < pAVar2) {
    if ((in_RSI == (ASTContext *)(ulong)*(uint *)&in_RDI[3].super_SyntaxNode.previewNode) &&
       (bVar1 = slang::syntax::NameSyntax::isKind(in_RCX->kind), bVar1)) {
      ASTContext::getCompilation((ASTContext *)0x93170d);
      slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(in_RCX);
      bitmask<slang::ast::LookupFlags>::bitmask
                ((bitmask<slang::ast::LookupFlags> *)&stack0xffffffffffffffcc,AllowRoot);
      local_8 = ArbitrarySymbolExpression::fromSyntax
                          (in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,in_stack_000002dc);
    }
    else {
      std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::operator[]
                ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
                 &in_RDI[2].super_SyntaxNode.parent,(size_type)in_RSI);
      memset(&stack0xffffffffffffffca,0,2);
      bitmask<slang::ast::VariableFlags>::bitmask
                ((bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffca);
      local_8 = Expression::bindArgument
                          ((Type *)syntax,args._4_4_,context._6_2_,in_stack_00000030,
                           in_stack_00000028);
    }
  }
  else {
    local_8 = SystemSubroutine::bindArgument
                        (in_R8,in_stack_ffffffffffffffc8,context_00,in_RDI,in_stack_ffffffffffffffb0
                        );
  }
  return local_8;
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex >= argTypes.size())
            return SystemSubroutine::bindArgument(argIndex, context, syntax, args);

        if (argIndex == nameOrHierIndex && NameSyntax::isKind(syntax.kind)) {
            return ArbitrarySymbolExpression::fromSyntax(context.getCompilation(),
                                                         syntax.as<NameSyntax>(), context,
                                                         LookupFlags::AllowRoot);
        }

        return Expression::bindArgument(*argTypes[argIndex], ArgumentDirection::In, {}, syntax,
                                        context);
    }